

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FFSFreeMarshalData(SstStream Stream)

{
  int *piVar1;
  long lVar2;
  void *pvVar3;
  long in_RDI;
  ControlInfo *next;
  ControlInfo *tmp;
  int i_1;
  FFSReaderMarshalBase *Info_1;
  int i;
  FFSMetadataInfoStruct *MBase;
  FFSWriterMarshalBase *Info;
  void *local_38;
  int local_2c;
  int local_1c;
  
  if (*(int *)(in_RDI + 0x10) == 1) {
    piVar1 = *(int **)(in_RDI + 0x1c0);
    lVar2 = *(long *)(in_RDI + 0x1d0);
    for (local_1c = 0; local_1c < *piVar1; local_1c = local_1c + 1) {
    }
    if (*(long *)(piVar1 + 2) != 0) {
      free(*(void **)(piVar1 + 2));
    }
    if (piVar1[6] != 0) {
      free_FMfield_list(*(undefined8 *)(piVar1 + 8));
    }
    if (piVar1[0xc] != 0) {
      free_FMfield_list(*(undefined8 *)(piVar1 + 0xe));
    }
    if (*(long *)(piVar1 + 4) != 0) {
      free_FMcontext(*(undefined8 *)(piVar1 + 4));
    }
    free(piVar1);
    *(undefined8 *)(in_RDI + 0x1c0) = 0;
    free(*(void **)(in_RDI + 0x1e0));
    *(undefined8 *)(in_RDI + 0x1e0) = 0;
    free(*(void **)(lVar2 + 8));
    free(*(void **)(in_RDI + 0x1d0));
    *(undefined8 *)(in_RDI + 0x1d0) = 0;
  }
  else {
    piVar1 = *(int **)(in_RDI + 0x300);
    if (piVar1 != (int *)0x0) {
      for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x238); local_2c = local_2c + 1) {
        if (*(long *)(*(long *)(piVar1 + 0x10) + (long)local_2c * 0x18 + 8) != 0) {
          free(*(void **)(*(long *)(piVar1 + 0x10) + (long)local_2c * 0x18 + 8));
        }
      }
      if (*(long *)(piVar1 + 0x10) != 0) {
        free(*(void **)(piVar1 + 0x10));
      }
      if (*(long *)(piVar1 + 8) != 0) {
        free(*(void **)(piVar1 + 8));
      }
      if (*(long *)(piVar1 + 10) != 0) {
        free(*(void **)(piVar1 + 10));
      }
      if (*(long *)(piVar1 + 0xc) != 0) {
        free(*(void **)(piVar1 + 0xc));
      }
      if (*(long *)(piVar1 + 0xe) != 0) {
        free(*(void **)(piVar1 + 0xe));
      }
      for (local_2c = 0; local_2c < *piVar1; local_2c = local_2c + 1) {
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 8));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x10));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x38));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x30));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x40));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x48));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x50));
        free(*(void **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_2c * 8) + 0x58));
        free(*(void **)(*(long *)(piVar1 + 2) + (long)local_2c * 8));
      }
      if (*(long *)(piVar1 + 2) != 0) {
        free(*(void **)(piVar1 + 2));
      }
      local_38 = *(void **)(piVar1 + 0x12);
      piVar1[0x12] = 0;
      piVar1[0x13] = 0;
      while (local_38 != (void *)0x0) {
        pvVar3 = *(void **)((long)local_38 + 0x10);
        free(local_38);
        local_38 = pvVar3;
      }
      free(piVar1);
      *(undefined8 *)(in_RDI + 0x300) = 0;
    }
  }
  return;
}

Assistant:

extern void FFSFreeMarshalData(SstStream Stream)
{
    if (Stream->Role == WriterRole)
    {
        /* writer side */
        struct FFSWriterMarshalBase *Info =
            (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
        struct FFSMetadataInfoStruct *MBase;
        MBase = Stream->M;

        for (int i = 0; i < Info->RecCount; i++)
        {
            //            free(Info->RecList[i].Type);
        }
        if (Info->RecList)
            free(Info->RecList);
        if (Info->MetaFieldCount)
            free_FMfield_list(Info->MetaFields);
        if (Info->DataFieldCount)
            free_FMfield_list(Info->DataFields);
        if (Info->LocalFMContext)
            free_FMcontext(Info->LocalFMContext);
        free(Info);
        Stream->WriterMarshalData = NULL;
        free(Stream->D);
        Stream->D = NULL;
        free(MBase->BitField);
        free(Stream->M);
        Stream->M = NULL;
    }
    else
    {
        /* reader side */
        struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
        if (Info)
        {
            int i;
            for (i = 0; i < Stream->WriterCohortSize; i++)
            {
                if (Info->WriterInfo[i].RawBuffer)
                    free(Info->WriterInfo[i].RawBuffer);
            }
            if (Info->WriterInfo)
                free(Info->WriterInfo);
            if (Info->MetadataBaseAddrs)
                free(Info->MetadataBaseAddrs);
            if (Info->MetadataFieldLists)
                free(Info->MetadataFieldLists);
            if (Info->DataBaseAddrs)
                free(Info->DataBaseAddrs);
            if (Info->DataFieldLists)
                free(Info->DataFieldLists);
            for (i = 0; i < Info->VarCount; i++)
            {
                free(Info->VarList[i]->VarName);
                free(Info->VarList[i]->PerWriterMetaFieldOffset);
                free(Info->VarList[i]->PerWriterBlockCount);
                free(Info->VarList[i]->PerWriterBlockStart);
                free(Info->VarList[i]->PerWriterStart);
                free(Info->VarList[i]->PerWriterCounts);
                free(Info->VarList[i]->PerWriterIncomingData);
                free(Info->VarList[i]->PerWriterIncomingSize);
                free(Info->VarList[i]);
            }
            if (Info->VarList)
                free(Info->VarList);

            struct ControlInfo *tmp = Info->ControlBlocks;
            Info->ControlBlocks = NULL;
            while (tmp)
            {
                struct ControlInfo *next = tmp->Next;
                free(tmp);
                tmp = next;
            }
            free(Info);
            Stream->ReaderMarshalData = NULL;
        }
    }
}